

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void ParseMod(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  pointer_____offset_0x10___ *ppuVar3;
  
  if ((chunklen * -0x33333333 >> 1 | (uint)((chunklen * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a
     ) {
    iVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[4])
                      (f,(ulong)((chunklen & 1) + chunklen),1);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      return;
    }
    uVar2 = __cxa_allocate_exception(1);
    ppuVar3 = &CIOErr::typeinfo;
  }
  else {
    uVar2 = __cxa_allocate_exception(1,f,CONCAT44(in_register_00000014,chunkid));
    ppuVar3 = &CBadForm::typeinfo;
  }
  __cxa_throw(uVar2,ppuVar3,0);
}

Assistant:

static void ParseMod(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	// Section 7.4, page 23:
	//		It [the PMOD sub-chunk] is always a multiple of ten bytes in length,
	//		and contains zero or more modulators plus a terminal record
	if (chunklen % 10 != 0)
	{
		throw CBadForm();
	}
	// We've checked the length, now ignore the chunk.
	skip_chunk(f, chunklen);
}